

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_cat_optionv(char *dest,size_t ndest,char *shortopts,char *longopts,char *datatype,
                    int optvalue,char *separator)

{
  char *pcVar1;
  long lVar2;
  char *end;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *dest_1;
  char cVar6;
  undefined4 in_register_0000008c;
  char *pcVar7;
  char *pcVar8;
  char shortopt [3];
  char local_57 [3];
  int local_54;
  size_t local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = "";
  if ((char *)CONCAT44(in_register_0000008c,optvalue) != (char *)0x0) {
    local_38 = (char *)CONCAT44(in_register_0000008c,optvalue);
  }
  pcVar8 = (char *)0xc7;
  local_54 = (int)datatype;
  if ((ndest != 0) && (cVar6 = *(char *)ndest, cVar6 != '\0')) {
    pcVar7 = (char *)ndest;
    do {
      local_57[0] = '-';
      local_57[1] = cVar6;
      local_57[2] = 0;
      pcVar5 = dest + (long)pcVar8;
      pcVar4 = local_57;
      if (0 < (long)pcVar8) {
        do {
          if (*dest == '\0') break;
          dest = dest + 1;
        } while (dest < pcVar5);
      }
      for (; (dest < pcVar5 && (*pcVar4 != '\0')); pcVar4 = pcVar4 + 1) {
        *dest = *pcVar4;
        dest = dest + 1;
      }
      *dest = '\0';
      pcVar8 = pcVar5 + -(long)dest;
      if (pcVar7[1] != '\0') {
        pcVar4 = dest + (long)pcVar8;
        pcVar1 = local_38;
        if (0 < (long)pcVar8) {
          do {
            if (*dest == '\0') break;
            dest = dest + 1;
          } while (dest < pcVar4);
        }
        for (; (dest < pcVar4 && (*pcVar1 != '\0')); pcVar1 = pcVar1 + 1) {
          *dest = *pcVar1;
          dest = dest + 1;
        }
        *dest = '\0';
        pcVar8 = pcVar5 + -(long)dest;
      }
      pcVar7 = pcVar7 + 1;
      cVar6 = *pcVar7;
    } while (cVar6 != '\0');
  }
  if (shortopts != (char *)0x0 && ndest != 0) {
    pcVar7 = dest + (long)pcVar8;
    pcVar5 = local_38;
    if (0 < (long)pcVar8) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar7);
    }
    for (; (dest < pcVar7 && (*pcVar5 != '\0')); pcVar5 = pcVar5 + 1) {
      *dest = *pcVar5;
      dest = dest + 1;
    }
    *dest = '\0';
    pcVar8 = pcVar7 + -(long)dest;
  }
  local_50 = ndest;
  local_48 = shortopts;
  local_40 = longopts;
  if (shortopts != (char *)0x0) {
    cVar6 = *shortopts;
    while (cVar6 != '\0') {
      pcVar7 = dest + (long)pcVar8;
      if (0 < (long)pcVar8) {
        do {
          if (*dest == '\0') break;
          dest = dest + 1;
        } while (dest < pcVar7);
      }
      if (dest < pcVar7) {
        lVar3 = 0;
        do {
          if (lVar3 == 2) break;
          pcVar8 = "--" + lVar3;
          pcVar5 = dest + lVar3;
          lVar3 = lVar3 + 1;
          *pcVar5 = *pcVar8;
        } while (pcVar5 + 1 < pcVar7);
        dest = dest + lVar3;
      }
      *dest = '\0';
      pcVar8 = pcVar7 + -(long)dest;
      pcVar4 = (char *)strcspn(shortopts,",");
      pcVar5 = pcVar8;
      if (pcVar4 < pcVar8) {
        pcVar5 = pcVar4;
      }
      strncat(dest,shortopts,(size_t)pcVar5);
      pcVar5 = shortopts + (long)pcVar4;
      if (shortopts[(long)pcVar4] == ',') {
        pcVar4 = dest + (long)pcVar8;
        pcVar1 = local_38;
        if (0 < (long)pcVar8) {
          do {
            if (*dest == '\0') break;
            dest = dest + 1;
          } while (dest < pcVar4);
        }
        for (; (dest < pcVar4 && (*pcVar1 != '\0')); pcVar1 = pcVar1 + 1) {
          *dest = *pcVar1;
          dest = dest + 1;
        }
        *dest = '\0';
        pcVar8 = pcVar7 + -(long)dest;
        pcVar5 = pcVar5 + 1;
      }
      shortopts = pcVar5;
      cVar6 = *pcVar5;
    }
  }
  if (local_40 == (char *)0x0) {
    return;
  }
  pcVar7 = dest;
  if (local_48 == (char *)0x0) {
    if (local_50 == 0) goto LAB_0010a43d;
    pcVar5 = dest + (long)pcVar8;
    if (0 < (long)pcVar8) {
      do {
        if (*pcVar7 == '\0') break;
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 < pcVar5);
    }
    if (pcVar7 < pcVar5) {
      lVar3 = 0;
      do {
        if (lVar3 == 1) break;
        lVar2 = lVar3 + 0xb;
        pcVar4 = pcVar7 + lVar3;
        lVar3 = lVar3 + 1;
        *pcVar4 = "%d msec(s), "[lVar2];
      } while (pcVar4 + 1 < pcVar5);
      goto LAB_0010a431;
    }
  }
  else {
    pcVar5 = dest + (long)pcVar8;
    if (0 < (long)pcVar8) {
      do {
        if (*pcVar7 == '\0') break;
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 < pcVar5);
    }
    if (pcVar7 < pcVar5) {
      lVar3 = 0;
      do {
        if (lVar3 == 1) break;
        pcVar4 = "=" + lVar3;
        pcVar1 = pcVar7 + lVar3;
        lVar3 = lVar3 + 1;
        *pcVar1 = *pcVar4;
      } while (pcVar1 + 1 < pcVar5);
LAB_0010a431:
      pcVar7 = pcVar7 + lVar3;
    }
  }
  *pcVar7 = '\0';
  pcVar8 = dest + ((long)pcVar8 - (long)pcVar7);
  dest = pcVar7;
LAB_0010a43d:
  pcVar7 = dest + (long)pcVar8;
  if (local_54 == 0) {
    if (0 < (long)pcVar8) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar7);
    }
    for (; (dest < pcVar7 && (*local_40 != '\0')); local_40 = local_40 + 1) {
      *dest = *local_40;
      dest = dest + 1;
    }
  }
  else {
    if (0 < (long)pcVar8) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar7);
    }
    if (dest < pcVar7) {
      lVar3 = 0;
      do {
        if (lVar3 == 1) break;
        lVar2 = lVar3 + 1;
        pcVar8 = dest + lVar3;
        lVar3 = lVar3 + 1;
        *pcVar8 = " ["[lVar2];
      } while (pcVar8 + 1 < pcVar7);
      dest = dest + lVar3;
    }
    *dest = '\0';
    if (pcVar7 != dest && -1 < (long)pcVar7 - (long)dest) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar7);
    }
    for (; (dest < pcVar7 && (*local_40 != '\0')); local_40 = local_40 + 1) {
      *dest = *local_40;
      dest = dest + 1;
    }
    *dest = '\0';
    if (pcVar7 != dest && -1 < (long)pcVar7 - (long)dest) {
      do {
        if (*dest == '\0') break;
        dest = dest + 1;
      } while (dest < pcVar7);
    }
    if (dest < pcVar7) {
      lVar3 = 0;
      do {
        if (lVar3 == 1) break;
        lVar2 = lVar3 + 8;
        pcVar8 = dest + lVar3;
        lVar3 = lVar3 + 1;
        *pcVar8 = "[[TRACE]]"[lVar2];
      } while (pcVar8 + 1 < pcVar7);
      dest = dest + lVar3;
    }
  }
  *dest = '\0';
  return;
}

Assistant:

static void arg_cat_optionv(char* dest, size_t ndest, const char* shortopts, const char* longopts, const char* datatype, int optvalue, const char* separator) {
    separator = separator ? separator : "";

    if (shortopts) {
        const char* c = shortopts;
        while (*c) {
            /* "-a|-b|-c" */
            char shortopt[3];

            /* note: shortopt array[] is initialiazed dynamically here to satisfy */
            /* a deficiency in the watcom compiler wrt static array initializers. */
            shortopt[0] = '-';
            shortopt[1] = *c;
            shortopt[2] = 0;

            arg_cat(&dest, shortopt, &ndest);
            if (*++c)
                arg_cat(&dest, separator, &ndest);
        }
    }

    /* put separator between long opts and short opts */
    if (shortopts && longopts)
        arg_cat(&dest, separator, &ndest);

    if (longopts) {
        const char* c = longopts;
        while (*c) {
            size_t ncspn;

            /* add "--" tag prefix */
            arg_cat(&dest, "--", &ndest);

            /* add comma separated option tag */
            ncspn = strcspn(c, ",");
#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
            strncat_s(dest, ndest, c, (ncspn < ndest) ? ncspn : ndest);
#else
            strncat(dest, c, (ncspn < ndest) ? ncspn : ndest);
#endif
            c += ncspn;

            /* add given separator in place of comma */
            if (*c == ',') {
                arg_cat(&dest, separator, &ndest);
                c++;
            }
        }
    }

    if (datatype) {
        if (longopts)
            arg_cat(&dest, "=", &ndest);
        else if (shortopts)
            arg_cat(&dest, " ", &ndest);

        if (optvalue) {
            arg_cat(&dest, "[", &ndest);
            arg_cat(&dest, datatype, &ndest);
            arg_cat(&dest, "]", &ndest);
        } else
            arg_cat(&dest, datatype, &ndest);
    }
}